

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O2

void affineMatrixTest1(void)

{
  ostream *poVar1;
  float *in_R8;
  float fVar2;
  Vector<float,_3UL> result;
  Matrix4 A2;
  AffineMatrix4 B;
  Matrix4 A;
  float local_15c;
  TransposedType local_158;
  undefined1 local_118 [56];
  float afStack_e0 [16];
  AffineMatrix4T<float> local_a0;
  Gs local_70 [64];
  
  afStack_e0[10] = 0.0;
  afStack_e0[0xb] = 0.0;
  afStack_e0[0xc] = 0.0;
  afStack_e0[0xd] = 1.0;
  afStack_e0[6] = 0.0;
  afStack_e0[7] = 1.0;
  afStack_e0[8] = 2.0;
  afStack_e0[9] = 0.0;
  afStack_e0[2] = 0.0;
  afStack_e0[3] = 8.0;
  afStack_e0[4] = 0.0;
  afStack_e0[5] = -4.0;
  local_118._48_4_ = 1.0;
  local_118._52_4_ = 0.0;
  afStack_e0[0] = -2.0;
  afStack_e0[1] = 6.0;
  local_158.m_[2] = 2.24208e-44;
  local_158.m_[3] = 0.0;
  local_158.m_._0_8_ = local_118 + 0x30;
  Gs::Matrix<float,_4UL,_4UL>::Matrix
            ((Matrix<float,_4UL,_4UL> *)local_70,(initializer_list<float> *)&local_158);
  afStack_e0[6] = 0.0;
  afStack_e0[7] = 1.0;
  afStack_e0[8] = 2.0;
  afStack_e0[9] = 0.0;
  afStack_e0[2] = 0.0;
  afStack_e0[3] = 8.0;
  afStack_e0[4] = 0.0;
  afStack_e0[5] = -4.0;
  local_118._48_4_ = 1.0;
  local_118._52_4_ = 0.0;
  afStack_e0[0] = -2.0;
  afStack_e0[1] = 6.0;
  local_158.m_[2] = 1.68156e-44;
  local_158.m_[3] = 0.0;
  local_158.m_._0_8_ = local_118 + 0x30;
  Gs::AffineMatrix4T<float>::AffineMatrix4T(&local_a0,(initializer_list<float> *)&local_158);
  Gs::Matrix<float,_4UL,_4UL>::operator=
            ((Matrix<float,_4UL,_4UL> *)(local_118 + 0x30),(ThisType *)local_70);
  local_118._0_4_ = 1.0;
  local_118._4_4_ = 1.0;
  local_118._8_4_ = 1.0;
  Gs::Normalize<Gs::Vector<float,3ul>,float>
            ((Vector<float,_3UL> *)&local_158,(Vector<float,_3UL> *)local_118);
  local_15c = 1.5707964;
  Gs::RotateFree<Gs::Matrix<float,4ul,4ul>,float>
            ((Matrix<float,_4UL,_4UL> *)(local_118 + 0x30),(Vector<float,_3UL> *)&local_158,
             &local_15c);
  poVar1 = std::operator<<((ostream *)&std::cout,"A = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"B = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>(poVar1,&local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"B^T = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  Gs::AffineMatrix4T<float>::Transposed(&local_158,&local_a0);
  poVar1 = Gs::operator<<(poVar1,&local_158);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Inv(B) = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  Gs::AffineMatrix4T<float>::Inverse((AffineMatrix4T<float> *)&local_158,&local_a0);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                     (poVar1,(AffineMatrix4T<float> *)&local_158);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"B*Inv(B) = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  Gs::AffineMatrix4T<float>::Inverse((AffineMatrix4T<float> *)local_118,&local_a0);
  Gs::Details::MulAffineMatrices<Gs::AffineMatrix4T,float>
            (&local_a0,(AffineMatrix4T<float> *)local_118);
  poVar1 = Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                     (poVar1,(AffineMatrix4T<float> *)&local_158);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"| A | = ");
  fVar2 = Gs::Determinant<float>((Matrix<float,_4UL,_4UL> *)local_70);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"| B | = ");
  fVar2 = Gs::Determinant<float>(&local_a0);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Trace A = ");
  fVar2 = Gs::Matrix<float,_4UL,_4UL>::Trace((Matrix<float,_4UL,_4UL> *)local_70);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Trace B = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,local_a0.m_[0] + local_a0.m_[4] + local_a0.m_[8] + 1.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"A1 = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)local_70);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"A2 = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)(local_118 + 0x30));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Lerp(A1, A2, 0.5) = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  local_118._0_4_ = 0.5;
  Gs::Lerp<Gs::Matrix<float,4ul,4ul>,float>
            (&local_158,local_70,(Matrix<float,_4UL,_4UL> *)(local_118 + 0x30),
             (Matrix<float,_4UL,_4UL> *)local_118,in_R8);
  poVar1 = Gs::operator<<(poVar1,&local_158);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"5 * I3 = ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  local_15c = 5.0;
  Gs::Matrix<float,_3UL,_3UL>::Identity();
  Gs::operator*((Matrix<float,_3UL,_3UL> *)&local_158,&local_15c,
                (Matrix<float,_3UL,_3UL> *)local_118);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_3UL,_3UL> *)&local_158);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void affineMatrixTest1()
{
    Matrix4 A
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0,
        0, 0, 0, 1
    };

    AffineMatrix4 B
    {
        1, 0, -2, 6,
        0, 8, 0, -4,
        0, 1, 2, 0
    };

    auto A2 = A;
    RotateFree(A2, Vector3(1, 1, 1).Normalized(), pi*0.5f);
    //B.MakeInverse();

    std::cout << "A = " << std::endl << A << std::endl;
    #if GS_ENABLE_INVERSE_OPERATOR
    std::cout << "Inv(A) = " << std::endl << (A^-1) << std::endl;
    std::cout << "A*Inv(A) = " << std::endl << A*(A^-1) << std::endl;
    #endif
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "B^T = " << std::endl << B.Transposed() << std::endl;
    std::cout << "Inv(B) = " << std::endl << B.Inverse() << std::endl;
    std::cout << "B*Inv(B) = " << std::endl << B*B.Inverse() << std::endl;
    std::cout << "| A | = " << A.Determinant() << std::endl;
    std::cout << "| B | = " << B.Determinant() << std::endl;
    std::cout << "Trace A = " << A.Trace() << std::endl;
    std::cout << "Trace B = " << B.Trace() << std::endl;
    std::cout << std::endl << "A1 = " << std::endl << A << std::endl;
    std::cout << std::endl << "A2 = " << std::endl << A2 << std::endl;
    std::cout << std::endl << "Lerp(A1, A2, 0.5) = " << std::endl << Lerp(A, A2, 0.5f) << std::endl;
    std::cout << std::endl << "5 * I3 = " << std::endl << Real(5) * Matrix3::Identity() << std::endl;
}